

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O0

char * IoTHubClient_Auth_Get_DeviceId(IOTHUB_AUTHORIZATION_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  char *result;
  IOTHUB_AUTHORIZATION_HANDLE handle_local;
  
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_Get_DeviceId",499,1,"Invalid Parameter handle: %p",0);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)handle->device_id;
  }
  return (char *)l;
}

Assistant:

const char* IoTHubClient_Auth_Get_DeviceId(IOTHUB_AUTHORIZATION_HANDLE handle)
{
    const char* result;
    if (handle == NULL)
    {
        LogError("Invalid Parameter handle: %p", handle);
        result = NULL;
    }
    else
    {
        result = handle->device_id;
    }
    return result;
}